

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O2

qint64 __thiscall QDataStream::skipRawData(QDataStream *this,qint64 len)

{
  bool bVar1;
  qint64 qVar2;
  QIODevice *this_00;
  
  this_00 = this->dev;
  qVar2 = -1;
  if (this_00 != (QIODevice *)0x0) {
    if (this->q_status != '\0') {
      bVar1 = QIODevice::isTransactionStarted(this_00);
      if (bVar1) {
        return -1;
      }
      this_00 = this->dev;
    }
    qVar2 = QIODevice::skip(this_00,len);
    if ((qVar2 != len) && (this->q_status == '\0')) {
      this->q_status = '\x01';
    }
  }
  return qVar2;
}

Assistant:

qint64 QDataStream::skipRawData(qint64 len)
{
    CHECK_STREAM_PRECOND(-1)
    if (q_status != Ok && dev->isTransactionStarted())
        return -1;

    const qint64 skipResult = dev->skip(len);
    if (skipResult != len)
        setStatus(ReadPastEnd);
    return skipResult;
}